

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_write_certificate_request(mbedtls_ssl_context *ssl)

{
  uchar *buf;
  mbedtls_key_exchange_type_t mVar1;
  mbedtls_ssl_ciphersuite_t *pmVar2;
  uchar *puVar3;
  uchar *puVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  size_t __n;
  uint uVar6;
  int iVar7;
  long lVar8;
  mbedtls_x509_crt *pmVar9;
  ushort *puVar10;
  uchar *puVar11;
  long local_50;
  
  pmVar2 = ssl->transform_negotiate->ciphersuite_info;
  puVar3 = ssl->out_msg;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
             ,0x936,"=> write certificate request");
  ssl->state = ssl->state + 1;
  uVar6 = ssl->handshake->sni_authmode;
  if (uVar6 == 3) {
    uVar6 = *(uint *)&ssl->conf->field_0x164 >> 2 & 3;
  }
  mVar1 = pmVar2->key_exchange;
  if (((mVar1 - MBEDTLS_KEY_EXCHANGE_PSK < 3) || (mVar1 == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK)) ||
     (uVar6 == 0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x947,"<= skip write certificate request");
    iVar7 = 0;
  }
  else {
    puVar4 = ssl->out_msg;
    puVar4[6] = '@';
    puVar4[4] = '\x02';
    puVar4[5] = '\x01';
    if (ssl->minor_ver == 3) {
      pmVar5 = ssl->handshake;
      pmVar5->verify_sig_alg = 4;
      uVar6 = ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384 | 4;
      pmVar5->verify_sig_alg = uVar6;
      puVar4[9] = (uchar)uVar6;
      puVar4[10] = '\x01';
      puVar4[0xb] = (uchar)ssl->handshake->verify_sig_alg;
      puVar4[0xc] = '\x03';
      puVar4[7] = '\0';
      puVar4[8] = '\x04';
      lVar8 = 0xd;
      local_50 = 6;
    }
    else {
      lVar8 = 7;
      local_50 = 0;
    }
    pmVar9 = ssl->handshake->sni_ca_chain;
    if (pmVar9 == (mbedtls_x509_crt *)0x0) {
      pmVar9 = ssl->conf->ca_chain;
    }
    puVar11 = puVar4 + lVar8;
    lVar8 = 0;
    while( true ) {
      puVar10 = (ushort *)(puVar11 + 2);
      if ((pmVar9 == (mbedtls_x509_crt *)0x0) || (pmVar9->version == 0)) goto LAB_001696fe;
      if (puVar3 + 0x4000 < puVar10) break;
      __n = (pmVar9->subject_raw).len;
      if ((ulong)((long)(puVar3 + 0x4000) - (long)puVar10) < __n + 2) break;
      buf = puVar11 + 4;
      *puVar10 = (ushort)__n << 8 | (ushort)__n >> 8;
      memcpy(buf,(pmVar9->subject_raw).p,__n);
      puVar11 = (uchar *)((long)puVar10 + __n);
      mbedtls_debug_print_buf
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0x9b8,"requested DN",buf,__n);
      lVar8 = lVar8 + __n + 2;
      pmVar9 = pmVar9->next;
    }
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9af,"skipping CAs: buffer too short");
LAB_001696fe:
    ssl->out_msglen = (long)puVar10 - (long)puVar4;
    ssl->out_msgtype = 0x16;
    *ssl->out_msg = '\r';
    ssl->out_msg[local_50 + 7] = (uchar)((ulong)lVar8 >> 8);
    ssl->out_msg[local_50 + 8] = (uchar)lVar8;
    iVar7 = mbedtls_ssl_write_record(ssl);
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0x9c6,"<= write certificate request");
  }
  return iVar7;
}

Assistant:

static int ssl_write_certificate_request( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    size_t dn_size, total_dn_size; /* excluding length bytes */
    size_t ct_len, sa_len; /* including length bytes */
    unsigned char *buf, *p;
    const unsigned char * const end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;
    const mbedtls_x509_crt *crt;
    int authmode;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate request" ) );

    ssl->state++;

#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_authmode != MBEDTLS_SSL_VERIFY_UNSET )
        authmode = ssl->handshake->sni_authmode;
    else
#endif
        authmode = ssl->conf->authmode;

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        authmode == MBEDTLS_SSL_VERIFY_NONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate request" ) );
        return( 0 );
    }

    /*
     *     0  .   0   handshake type
     *     1  .   3   handshake length
     *     4  .   4   cert type count
     *     5  .. m-1  cert types
     *     m  .. m+1  sig alg length (TLS 1.2 only)
     *    m+1 .. n-1  SignatureAndHashAlgorithms (TLS 1.2 only)
     *     n  .. n+1  length of all DNs
     *    n+2 .. n+3  length of DN 1
     *    n+4 .. ...  Distinguished Name #1
     *    ... .. ...  length of DN 2, etc.
     */
    buf = ssl->out_msg;
    p = buf + 4;

    /*
     * Supported certificate types
     *
     *     ClientCertificateType certificate_types<1..2^8-1>;
     *     enum { (255) } ClientCertificateType;
     */
    ct_len = 0;

#if defined(MBEDTLS_RSA_C)
    p[1 + ct_len++] = MBEDTLS_SSL_CERT_TYPE_RSA_SIGN;
#endif
#if defined(MBEDTLS_ECDSA_C)
    p[1 + ct_len++] = MBEDTLS_SSL_CERT_TYPE_ECDSA_SIGN;
#endif

    p[0] = (unsigned char) ct_len++;
    p += ct_len;

    sa_len = 0;
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
    /*
     * Add signature_algorithms for verify (TLS 1.2)
     *
     *     SignatureAndHashAlgorithm supported_signature_algorithms<2..2^16-2>;
     *
     *     struct {
     *           HashAlgorithm hash;
     *           SignatureAlgorithm signature;
     *     } SignatureAndHashAlgorithm;
     *
     *     enum { (255) } HashAlgorithm;
     *     enum { (255) } SignatureAlgorithm;
     */
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        /*
         * Only use current running hash algorithm that is already required
         * for requested ciphersuite.
         */
        ssl->handshake->verify_sig_alg = MBEDTLS_SSL_HASH_SHA256;

        if( ssl->transform_negotiate->ciphersuite_info->mac ==
            MBEDTLS_MD_SHA384 )
        {
            ssl->handshake->verify_sig_alg = MBEDTLS_SSL_HASH_SHA384;
        }

        /*
         * Supported signature algorithms
         */
#if defined(MBEDTLS_RSA_C)
        p[2 + sa_len++] = ssl->handshake->verify_sig_alg;
        p[2 + sa_len++] = MBEDTLS_SSL_SIG_RSA;
#endif
#if defined(MBEDTLS_ECDSA_C)
        p[2 + sa_len++] = ssl->handshake->verify_sig_alg;
        p[2 + sa_len++] = MBEDTLS_SSL_SIG_ECDSA;
#endif

        p[0] = (unsigned char)( sa_len >> 8 );
        p[1] = (unsigned char)( sa_len      );
        sa_len += 2;
        p += sa_len;
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */

    /*
     * DistinguishedName certificate_authorities<0..2^16-1>;
     * opaque DistinguishedName<1..2^16-1>;
     */
    p += 2;
#if defined(MBEDTLS_SSL_SERVER_NAME_INDICATION)
    if( ssl->handshake->sni_ca_chain != NULL )
        crt = ssl->handshake->sni_ca_chain;
    else
#endif
        crt = ssl->conf->ca_chain;

    total_dn_size = 0;
    while( crt != NULL && crt->version != 0 )
    {
        dn_size = crt->subject_raw.len;

        if( end < p || (size_t)( end - p ) < 2 + dn_size )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "skipping CAs: buffer too short" ) );
            break;
        }

        *p++ = (unsigned char)( dn_size >> 8 );
        *p++ = (unsigned char)( dn_size      );
        memcpy( p, crt->subject_raw.p, dn_size );
        p += dn_size;

        MBEDTLS_SSL_DEBUG_BUF( 3, "requested DN", p - dn_size, dn_size );

        total_dn_size += 2 + dn_size;
        crt = crt->next;
    }

    ssl->out_msglen  = p - buf;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE_REQUEST;
    ssl->out_msg[4 + ct_len + sa_len] = (unsigned char)( total_dn_size  >> 8 );
    ssl->out_msg[5 + ct_len + sa_len] = (unsigned char)( total_dn_size       );

    ret = mbedtls_ssl_write_record( ssl );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate request" ) );

    return( ret );
}